

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

void __thiscall pstore::file::file_handle::seek(file_handle *this,uint64_t position)

{
  __off_t _Var1;
  int *piVar2;
  int iVar3;
  ulong __offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  ensure_open(this);
  iVar3 = 0;
  while( true ) {
    __offset = 0x7fffffffffffffff;
    if (position < 0x7fffffffffffffff) {
      __offset = position;
    }
    _Var1 = lseek(this->file_,__offset,iVar3);
    if (_Var1 == -1) break;
    iVar3 = 1;
    position = position - __offset;
    if (position == 0) {
      return;
    }
  }
  piVar2 = __errno_location();
  iVar3 = *piVar2;
  std::__cxx11::string::string((string *)&bStack_48,(string *)&this->path_);
  (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
            (iVar3,"lseek/SEEK_SET failed",&bStack_48);
}

Assistant:

void file_handle::seek (std::uint64_t position) {
            this->ensure_open ();

            using common_type = std::common_type<uoff_type, std::uint64_t>::type;
            static constexpr auto max =
                static_cast<common_type> (std::numeric_limits<off_t>::max ());

            int mode = SEEK_SET;
            do {
                auto const offset = std::min (static_cast<common_type> (position), max);

                if (::lseek (file_, static_cast<off_t> (offset), mode) == off_t{-1}) {
                    int const err = errno;
                    raise_file_error (err, "lseek/SEEK_SET failed", this->path ());
                }

                position -= offset;
                mode = SEEK_CUR;
            } while (position > 0);
        }